

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmGetNextLine(SyString *pCursor,SyString *pCurrent)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  long lVar8;
  char cVar9;
  byte *pbVar10;
  byte bVar11;
  bool bVar12;
  char *pcVar7;
  
  uVar5 = pCursor->nByte;
  bVar12 = uVar5 == 0;
  if (!bVar12) {
    pbVar10 = (byte *)pCursor->zString;
    bVar11 = *pbVar10;
    if (bVar11 < 0xc0) {
      ppuVar2 = __ctype_b_loc();
      uVar5 = uVar5 - 1;
      do {
        pbVar10 = pbVar10 + 1;
        if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar11 * 2 + 1) & 0x20) == 0) break;
        pCursor->nByte = uVar5;
        pCursor->zString = (char *)pbVar10;
        bVar12 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar12) goto LAB_001232f1;
        bVar11 = *pbVar10;
      } while (bVar11 < 0xc0);
      uVar5 = uVar5 + 1;
    }
    if (!bVar12) {
      pcVar1 = pCursor->zString;
      pcVar4 = pcVar1 + uVar5;
      pcVar3 = pcVar1;
      do {
        cVar9 = '\r';
        lVar8 = 0;
        do {
          if (*pcVar3 == cVar9) {
            uVar6 = (int)pcVar3 - (int)pcVar1;
            bVar12 = true;
            goto LAB_001233d2;
          }
          cVar9 = "\r\n"[lVar8 + 1];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
        pcVar7 = pcVar3 + 1;
        if (pcVar4 <= pcVar7) break;
        cVar9 = '\r';
        lVar8 = 0;
        do {
          if (*pcVar7 == cVar9) goto LAB_001233cc;
          cVar9 = "\r\n"[lVar8 + 1];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
        pcVar7 = pcVar3 + 2;
        if (pcVar4 <= pcVar7) break;
        cVar9 = '\r';
        lVar8 = 0;
        do {
          if (*pcVar7 == cVar9) goto LAB_001233cc;
          cVar9 = "\r\n"[lVar8 + 1];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
        pcVar7 = pcVar3 + 3;
        if (pcVar4 <= pcVar7) break;
        cVar9 = '\r';
        lVar8 = 0;
        do {
          if (*pcVar7 == cVar9) goto LAB_001233cc;
          cVar9 = "\r\n"[lVar8 + 1];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
        pcVar3 = pcVar3 + 4;
      } while (pcVar3 < pcVar4);
      uVar6 = (uint)pcVar3;
      bVar12 = false;
LAB_001233d2:
      pCurrent->zString = pcVar1;
      if (bVar12) {
        pCurrent->nByte = uVar6;
        pCursor->zString = pcVar1 + uVar6;
        pCursor->nByte = pCursor->nByte - uVar6;
        return 0;
      }
      pCurrent->nByte = uVar5;
      return -8;
    }
  }
LAB_001232f1:
  pCurrent->zString = (char *)0x0;
  pCurrent->nByte = 0;
  return -0x12;
LAB_001233cc:
  uVar6 = (int)pcVar7 - (int)pcVar1;
  bVar12 = true;
  goto LAB_001233d2;
}

Assistant:

static sxi32 VmGetNextLine(SyString *pCursor, SyString *pCurrent)
{ 
  	const char *zIn;
  	sxu32 nPos; 
	/* Jump leading white spaces */
	SyStringLeftTrim(pCursor);
	if( pCursor->nByte < 1 ){
		SyStringInitFromBuf(pCurrent, 0, 0);
		return SXERR_EOF; /* End of input */
	}
	zIn = SyStringData(pCursor);
	if( SXRET_OK != SyByteListFind(pCursor->zString, pCursor->nByte, "\r\n", &nPos) ){
		/* Line not found, tell the caller to read more input from source */
		SyStringDupPtr(pCurrent, pCursor);
		return SXERR_MORE;
	}
  	pCurrent->zString = zIn;
  	pCurrent->nByte	= nPos;	
  	/* advance the cursor so we can call this routine again */
  	pCursor->zString = &zIn[nPos];
  	pCursor->nByte -= nPos;
  	return SXRET_OK;
 }